

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetresizehandler.cpp
# Opt level: O0

void __thiscall QWidgetResizeHandler::doResize(QWidgetResizeHandler *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  QPoint QVar4;
  Representation m;
  long in_RDI;
  long in_FS_OFFSET;
  QRect *in_stack_ffffffffffffff88;
  QWidget *pQVar5;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  QCursor local_40;
  QRect local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 0x40) >> 2 & 1) != 0) {
    *(byte *)(in_RDI + 0x40) = *(byte *)(in_RDI + 0x40) & 0xfd | 2;
    pQVar5 = *(QWidget **)(in_RDI + 0x10);
    QCursor::pos();
    QVar4 = QWidget::mapFromGlobal
                      (pQVar5,(QPoint *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    *(QPoint *)(in_RDI + 0x20) = QVar4;
    iVar2 = QPoint::x((QPoint *)0x66b079);
    iVar3 = QWidget::width((QWidget *)0x66b08d);
    if (iVar2 < iVar3 / 2) {
      in_stack_ffffffffffffff9c = QPoint::y((QPoint *)0x66b0ad);
      iVar3 = QWidget::height((QWidget *)0x66b0c1);
      if (in_stack_ffffffffffffff9c < iVar3 / 2) {
        *(undefined4 *)(in_RDI + 0x30) = 1;
      }
      else {
        *(undefined4 *)(in_RDI + 0x30) = 3;
      }
    }
    else {
      in_stack_ffffffffffffff98 = QPoint::y((QPoint *)0x66b0fd);
      iVar3 = QWidget::height((QWidget *)0x66b111);
      if (in_stack_ffffffffffffff98 < iVar3 / 2) {
        *(undefined4 *)(in_RDI + 0x30) = 4;
      }
      else {
        *(undefined4 *)(in_RDI + 0x30) = 2;
      }
    }
    local_38 = QWidget::rect((QWidget *)CONCAT44(iVar2,in_stack_ffffffffffffffa8));
    QVar4 = QRect::bottomRight(in_stack_ffffffffffffff88);
    m = QVar4.yp.m_i;
    QVar4 = ::operator-((QPoint *)pQVar5,
                        (QPoint *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    *(QPoint *)(in_RDI + 0x28) = QVar4;
    setMouseCursor((QWidgetResizeHandler *)QVar4,m.m_i);
    pQVar5 = *(QWidget **)(in_RDI + 0x10);
    QWidget::cursor((QWidget *)CONCAT44(iVar2,in_stack_ffffffffffffffa8));
    QWidget::grabMouse(pQVar5,(QCursor *)in_stack_ffffffffffffff88);
    QCursor::~QCursor(&local_40);
    QWidget::grabKeyboard(pQVar5);
    resizeHorizontalDirectionFixed = false;
    resizeVerticalDirectionFixed = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetResizeHandler::doResize()
{
    if (!enabled)
        return;

    active = true;
    moveOffset = widget->mapFromGlobal(QCursor::pos());
    if (moveOffset.x() < widget->width()/2) {
        if (moveOffset.y() < widget->height()/2)
            mode = TopLeft;
        else
            mode = BottomLeft;
    } else {
        if (moveOffset.y() < widget->height()/2)
            mode = TopRight;
        else
            mode = BottomRight;
    }
    invertedMoveOffset = widget->rect().bottomRight() - moveOffset;
#ifndef QT_NO_CURSOR
    setMouseCursor(mode);
    widget->grabMouse(widget->cursor() );
#else
    widget->grabMouse();
#endif
    widget->grabKeyboard();
    resizeHorizontalDirectionFixed = false;
    resizeVerticalDirectionFixed = false;
}